

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

void mpz_ior(__mpz_struct *r,__mpz_struct *u,__mpz_struct *v)

{
  mp_limb_t *pmVar1;
  mp_limb_t *pmVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  __mpz_struct *p_Var6;
  ulong uVar7;
  ulong uVar8;
  mp_size_t mVar9;
  __mpz_struct *in_RDX;
  __mpz_struct *in_RSI;
  int *in_RDI;
  bool bVar10;
  bool bVar11;
  mp_size_t __mp_size_t_swap__tmp;
  mpz_srcptr __mpz_srcptr_swap__tmp;
  mp_limb_t rl;
  mp_limb_t vl;
  mp_limb_t ul;
  mp_limb_t rc;
  mp_limb_t vc;
  mp_limb_t uc;
  mp_limb_t rx;
  mp_limb_t vx;
  mp_limb_t ux;
  mp_ptr rp;
  mp_ptr vp;
  mp_ptr up;
  mp_size_t i;
  mp_size_t rn;
  mp_size_t vn;
  mp_size_t un;
  int local_c8;
  mp_srcptr local_c0;
  int iVar12;
  int iVar13;
  __mpz_struct *in_stack_ffffffffffffff58;
  __mpz_struct *in_stack_ffffffffffffff60;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  long local_38;
  int local_30;
  __mpz_struct *local_28;
  __mpz_struct *local_20;
  __mpz_struct *local_18;
  __mpz_struct *local_10;
  
  if (in_RSI->_mp_size < 0) {
    iVar13 = -in_RSI->_mp_size;
  }
  else {
    iVar13 = in_RSI->_mp_size;
  }
  local_20 = (__mpz_struct *)(long)iVar13;
  if (in_RDX->_mp_size < 0) {
    iVar12 = -in_RDX->_mp_size;
  }
  else {
    iVar12 = in_RDX->_mp_size;
  }
  p_Var6 = (__mpz_struct *)(long)iVar12;
  local_28 = p_Var6;
  local_18 = in_RDX;
  local_10 = in_RSI;
  if ((long)local_20 < (long)p_Var6) {
    in_stack_ffffffffffffff58 = local_20;
    in_stack_ffffffffffffff60 = in_RSI;
    local_28 = local_20;
    local_20 = p_Var6;
    local_18 = in_RSI;
    local_10 = in_RDX;
  }
  if (local_28 == (__mpz_struct *)0x0) {
    mpz_set(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  }
  else {
    bVar10 = local_10->_mp_size < 0;
    local_70 = (ulong)bVar10;
    bVar11 = local_18->_mp_size < 0;
    local_78 = (ulong)bVar11;
    local_80 = (ulong)(bVar10 || bVar11);
    uVar3 = -local_70;
    uVar4 = -local_78;
    uVar5 = -local_80;
    if (uVar4 != 0) {
      local_20 = local_28;
    }
    if ((long)*in_RDI < (long)((long)&local_20->_mp_alloc + local_80)) {
      local_c0 = mpz_realloc((__mpz_struct *)CONCAT44(iVar13,iVar12),(mp_size_t)local_20);
    }
    else {
      local_c0 = *(mp_srcptr *)(in_RDI + 2);
    }
    pmVar1 = local_10->_mp_d;
    pmVar2 = local_18->_mp_d;
    local_38 = 0;
    do {
      uVar7 = (pmVar1[local_38] ^ uVar3) + local_70;
      local_70 = (ulong)(uVar7 < local_70);
      uVar8 = (pmVar2[local_38] ^ uVar4) + local_78;
      local_78 = (ulong)(uVar8 < local_78);
      uVar7 = ((uVar7 | uVar8) ^ uVar5) + local_80;
      local_80 = (ulong)(uVar7 < local_80);
      local_c0[local_38] = uVar7;
      local_38 = local_38 + 1;
    } while (local_38 < (long)local_28);
    for (; local_38 < (long)local_20; local_38 = local_38 + 1) {
      uVar7 = (pmVar1[local_38] ^ uVar3) + local_70;
      local_70 = (ulong)(uVar7 < local_70);
      uVar7 = ((uVar7 | uVar4) ^ uVar5) + local_80;
      local_80 = (ulong)(uVar7 < local_80);
      local_c0[local_38] = uVar7;
    }
    if (local_80 == 0) {
      mVar9 = mpn_normalized_size(local_c0,(mp_size_t)local_20);
      local_30 = (int)mVar9;
    }
    else {
      local_30 = (int)local_20 + 1;
      local_c0[(long)local_20] = local_80;
    }
    if (uVar5 == 0) {
      local_c8 = local_30;
    }
    else {
      local_c8 = -local_30;
    }
    in_RDI[1] = local_c8;
  }
  return;
}

Assistant:

void
mpz_ior (mpz_t r, const mpz_t u, const mpz_t v)
{
  mp_size_t un, vn, rn, i;
  mp_ptr up, vp, rp;

  mp_limb_t ux, vx, rx;
  mp_limb_t uc, vc, rc;
  mp_limb_t ul, vl, rl;

  un = GMP_ABS (u->_mp_size);
  vn = GMP_ABS (v->_mp_size);
  if (un < vn)
    {
      MPZ_SRCPTR_SWAP (u, v);
      MP_SIZE_T_SWAP (un, vn);
    }
  if (vn == 0)
    {
      mpz_set (r, u);
      return;
    }

  uc = u->_mp_size < 0;
  vc = v->_mp_size < 0;
  rc = uc | vc;

  ux = -uc;
  vx = -vc;
  rx = -rc;

  /* If the smaller input is negative, by sign extension higher limbs
     don't matter. */
  rn = vx ? vn : un;

  rp = MPZ_REALLOC (r, rn + (mp_size_t) rc);

  up = u->_mp_d;
  vp = v->_mp_d;

  i = 0;
  do
    {
      ul = (up[i] ^ ux) + uc;
      uc = ul < uc;

      vl = (vp[i] ^ vx) + vc;
      vc = vl < vc;

      rl = ( (ul | vl) ^ rx) + rc;
      rc = rl < rc;
      rp[i] = rl;
    }
  while (++i < vn);
  assert (vc == 0);

  for (; i < rn; i++)
    {
      ul = (up[i] ^ ux) + uc;
      uc = ul < uc;

      rl = ( (ul | vx) ^ rx) + rc;
      rc = rl < rc;
      rp[i] = rl;
    }
  if (rc)
    rp[rn++] = rc;
  else
    rn = mpn_normalized_size (rp, rn);

  r->_mp_size = rx ? -rn : rn;
}